

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_codecvt.h
# Opt level: O0

result __thiscall
booster::locale::generic_codecvt<wchar_t,_booster::locale::utf8_codecvt<wchar_t>,_4>::do_out
          (generic_codecvt<wchar_t,_booster::locale::utf8_codecvt<wchar_t>,_4> *this,
          mbstate_t *param_2,uchar *from,uchar *from_end,uchar **from_next,char *to,char *to_end,
          char **to_next)

{
  bool bVar1;
  code_point cVar2;
  code_point *in_RCX;
  code_point *in_RDX;
  generic_codecvt<wchar_t,_booster::locale::utf8_codecvt<wchar_t>,_4> *in_RDI;
  undefined8 *in_R8;
  ulong in_R9;
  ulong in_stack_00000008;
  ulong *in_stack_00000010;
  uint32_t len;
  uint32_t ch;
  state_type cvt_state;
  result r;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffffc8;
  result rVar4;
  ulong local_30;
  code_point *local_18;
  
  rVar4 = ok;
  implementation(in_RDI);
  utf8_codecvt<wchar_t>::initial_state(from_unicode_state);
  local_30 = in_R9;
  local_18 = in_RDX;
  do {
    uVar3 = local_30 < in_stack_00000008 && local_18 < in_RCX;
    if (local_30 >= in_stack_00000008 || local_18 >= in_RCX) {
LAB_00259707:
      *in_R8 = local_18;
      *in_stack_00000010 = local_30;
      if ((rVar4 == ok) && (local_18 != in_RCX)) {
        rVar4 = partial;
      }
      return rVar4;
    }
    cVar2 = *local_18;
    bVar1 = utf::is_valid_codepoint(cVar2);
    if (!bVar1) {
      rVar4 = error;
      goto LAB_00259707;
    }
    implementation(in_RDI);
    cVar2 = utf8_codecvt<wchar_t>::from_unicode
                      ((state_type *)CONCAT44(rVar4,in_stack_ffffffffffffffc8),cVar2,(char *)in_RDI,
                       (char *)CONCAT17(uVar3,in_stack_ffffffffffffffb0));
    if (cVar2 == 0xfffffffe) {
      rVar4 = partial;
      goto LAB_00259707;
    }
    if (cVar2 == 0xffffffff) {
      rVar4 = error;
      goto LAB_00259707;
    }
    local_30 = local_30 + cVar2;
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

virtual std::codecvt_base::result 
    do_out( std::mbstate_t &/*std_state*/,
            uchar const *from,
            uchar const *from_end,
            uchar const *&from_next,
            char *to,
            char *to_end,
            char *&to_next) const
    {
        std::codecvt_base::result r=std::codecvt_base::ok;
        typedef typename CodecvtImpl::state_type state_type;
        state_type cvt_state = implementation().initial_state(generic_codecvt_base::from_unicode_state);
        while(to < to_end && from < from_end)
        {
#ifdef DEBUG_CODECVT            
        std::cout << "Entering OUT --------------" << std::endl;
        std::cout << "State " << std::hex << state <<std::endl;
        std::cout << "Left in " << std::dec << from_end - from << " out " << to_end -to << std::endl;
#endif            
            booster::uint32_t ch=0;
            ch = *from;
            if(!booster::locale::utf::is_valid_codepoint(ch)) {
                r=std::codecvt_base::error;
                break;
            }
            booster::uint32_t len = implementation().from_unicode(cvt_state,ch,to,to_end);
            if(len == booster::locale::utf::incomplete) {
                r=std::codecvt_base::partial;
                break;
            }
            else if(len == booster::locale::utf::illegal) {
                r=std::codecvt_base::error;
                break;
            }
            to+=len;
            from++;
        }
        from_next=from;
        to_next=to;
        if(r==std::codecvt_base::ok && from!=from_end)
            r = std::codecvt_base::partial;
#ifdef DEBUG_CODECVT            
        std::cout << "Returning ";
        switch(r) {
        case std::codecvt_base::ok:
            std::cout << "ok" << std::endl;
            break;
        case std::codecvt_base::partial:
            std::cout << "partial" << std::endl;
            break;
        case std::codecvt_base::error:
            std::cout << "error" << std::endl;
            break;
        default:
            std::cout << "other" << std::endl;
            break;
        }
        std::cout << "State " << std::hex << state <<std::endl;
        std::cout << "Left in " << std::dec << from_end - from << " out " << to_end -to << std::endl;
#endif            
        return r;
    }